

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::anon_unknown_1::RenderingContext::RenderingContext
          (RenderingContext *this,EglTestContext *eglTestCtx,EGLint *attribList,EGLConfig *config,
          EGLDisplay *display,EGLContext *sharedContext)

{
  Library *pLVar1;
  EGLContext *sharedContext_local;
  EGLDisplay *display_local;
  EGLConfig *config_local;
  EGLint *attribList_local;
  EglTestContext *eglTestCtx_local;
  RenderingContext *this_local;
  
  this->m_eglTestCtx = eglTestCtx;
  this->m_attribList = attribList;
  this->m_config = config;
  this->m_display = display;
  pLVar1 = EglTestContext::getLibrary(eglTestCtx);
  this->m_egl = pLVar1;
  this->m_context = (EGLContext)0x0;
  logAttribList(eglTestCtx,this->m_attribList);
  createContext(this,sharedContext);
  return;
}

Assistant:

RenderingContext::RenderingContext (const EglTestContext&	 eglTestCtx,
									const EGLint*			 attribList,
									const EGLConfig&		 config,
									const EGLDisplay&		 display,
									const EGLContext&		 sharedContext)
	: m_eglTestCtx		(eglTestCtx)
	, m_attribList		(attribList)
	, m_config			(config)
	, m_display			(display)
	, m_egl				(eglTestCtx.getLibrary())
	, m_context			(EGL_NO_CONTEXT)
{
	logAttribList(eglTestCtx, m_attribList);
	createContext(sharedContext);
}